

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O0

QString * QSystemError::string(ErrorScope errorScope,int errorCode)

{
  long lVar1;
  undefined4 in_EDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI == 0) || (in_ESI != 1 && in_ESI != 2)) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT44(in_ESI,in_EDX),CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
  }
  else {
    standardLibraryErrorString(in_ESI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSystemError::string(ErrorScope errorScope, int errorCode)
{
    switch (errorScope) {
    case NativeError:
#if defined(Q_OS_WIN)
        return windowsErrorString(errorCode);
#endif // else unix: native and standard library are the same
    case StandardLibraryError:
        return standardLibraryErrorString(errorCode);
    default:
        qWarning("invalid error scope");
        Q_FALLTHROUGH();
    case NoError:
        return u"No error"_s;
    }
}